

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<std::__cxx11::string,char[35],unsigned_long>
          (string *__return_storage_ptr__,Diligent *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args,
          char (*Args_1) [35],unsigned_long *Args_2)

{
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,*(char **)this,*(long *)(this + 8));
  FormatStrSS<std::__cxx11::stringstream,char[35],unsigned_long>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)asStack_1a8,
             (char (*) [35])Args,(unsigned_long *)Args_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}